

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O1

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_allocate_medium(t_heap<xemmai::t_object> *this,size_t a_size)

{
  t_object *ptVar1;
  long in_FS_OFFSET;
  
  if (a_size < 0x101) {
    ptVar1 = *(t_object **)(in_FS_OFFSET + -0x50);
    if (ptVar1 == (t_object *)0x0) {
      ptVar1 = t_of<1UL,_16384UL>::f_allocate(&this->v_of1,this);
    }
    *(t_object **)(in_FS_OFFSET + -0x50) = ptVar1->v_next;
  }
  else if (a_size < 0x201) {
    ptVar1 = *(t_object **)(in_FS_OFFSET + -0x48);
    if (ptVar1 == (t_object *)0x0) {
      ptVar1 = t_of<2UL,_4096UL>::f_allocate(&this->v_of2,this);
    }
    *(t_object **)(in_FS_OFFSET + -0x48) = ptVar1->v_next;
  }
  else if (a_size < 0x401) {
    ptVar1 = *(t_object **)(in_FS_OFFSET + -0x40);
    if (ptVar1 == (t_object *)0x0) {
      ptVar1 = t_of<3UL,_1024UL>::f_allocate(&this->v_of3,this);
    }
    *(t_object **)(in_FS_OFFSET + -0x40) = ptVar1->v_next;
  }
  else {
    if (0x800 < a_size) {
      ptVar1 = f_allocate_large(this,a_size);
      return ptVar1;
    }
    ptVar1 = *(t_object **)(in_FS_OFFSET + -0x38);
    if (ptVar1 == (t_object *)0x0) {
      ptVar1 = t_of<4UL,_256UL>::f_allocate(&this->v_of4,this);
    }
    *(t_object **)(in_FS_OFFSET + -0x38) = ptVar1->v_next;
  }
  return ptVar1;
}

Assistant:

constexpr T* t_heap<T>::f_allocate_medium(size_t a_size)
{
	if (a_size <= c_UNIT << 1) return f_allocate(v_of1);
	if (a_size <= c_UNIT << 2) return f_allocate(v_of2);
	if (a_size <= c_UNIT << 3) return f_allocate(v_of3);
	if (a_size <= c_UNIT << 4) return f_allocate(v_of4);
	return f_allocate_large(a_size);
}